

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O3

void __thiscall mjs::token::token(token *this,token_type type,wstring *text)

{
  pointer pwVar1;
  
  this->type_ = type;
  (this->field_1).ivalue_ = (uint64_t)((long)&this->field_1 + 0x10);
  pwVar1 = (text->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->field_1,pwVar1,pwVar1 + text->_M_string_length);
  if ((this->type_ != identifier) && (this->type_ != string_literal)) {
    __assert_fail("has_text()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h",
                  0xac,"mjs::token::token(token_type, const std::wstring &)");
  }
  return;
}

Assistant:

explicit token(token_type type, const std::wstring& text) : type_(type), text_(text) {
        assert(has_text());
    }